

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlPushInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr input)

{
  xmlParserInputPtr pxVar1;
  int iVar2;
  
  if (input == (xmlParserInputPtr)0x0 || ctxt == (xmlParserCtxtPtr)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = xmlCtxtPushInput(ctxt,input);
    if (((-1 < iVar2) && (pxVar1 = ctxt->input, (pxVar1->flags & 0x40) == 0)) &&
       ((long)pxVar1->end - (long)pxVar1->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  }
  return iVar2;
}

Assistant:

int
xmlPushInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr input) {
    int ret;

    if ((ctxt == NULL) || (input == NULL))
        return(-1);

    ret = xmlCtxtPushInput(ctxt, input);
    if (ret >= 0)
        GROW;
    return(ret);
}